

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::FileDisplayTask::checkArguments
          (FileDisplayTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  Args local_30;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,1,0x7fffffff);
  if (bVar2) {
    bVar2 = Type::isIntegral(((*args->_M_ptr)->type).ptr);
    if (!bVar2) {
      pTVar3 = SystemSubroutine::badArg((SystemSubroutine *)this,context,*args->_M_ptr);
      return pTVar3;
    }
    local_30._M_extent._M_extent_value = (args->_M_extent)._M_extent_value - 1;
    local_30._M_ptr = args->_M_ptr + 1;
    bVar2 = FmtHelpers::checkDisplayArgs(context,&local_30);
    if (bVar2) {
      return pCVar1->voidType;
    }
  }
  return pCVar1->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const override {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, INT32_MAX))
            return comp.getErrorType();

        if (!args[0]->type->isIntegral())
            return badArg(context, *args[0]);

        if (!FmtHelpers::checkDisplayArgs(context, args.subspan(1)))
            return comp.getErrorType();

        return comp.getVoidType();
    }